

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O2

int __thiscall cmsys::CommandLineArguments::Parse(CommandLineArguments *this)

{
  bool bVar1;
  int iVar2;
  mapped_type *cs;
  ulong uVar3;
  char *pcVar4;
  Internal *pIVar5;
  ostream *poVar6;
  size_type *psVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *psVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  matches;
  string local_50 [32];
  
  matches.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  matches.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  matches.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->StoreUnusedArgumentsFlag == true) {
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::clear
              (&(this->Internals->UnusedArguments).
                super_vector<cmsys::String,_std::allocator<cmsys::String>_>);
  }
  uVar14 = 0;
  do {
    pIVar5 = this->Internals;
    lVar10 = (long)(pIVar5->Argv).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                   super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if ((ulong)((long)(pIVar5->Argv).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                      super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                      super__Vector_impl_data._M_finish - lVar10 >> 5) <= uVar14) {
      iVar9 = 1;
LAB_00118c95:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&matches);
      return iVar9;
    }
    lVar13 = uVar14 * 0x20;
    psVar11 = (string *)(lVar10 + lVar13);
    pIVar5->LastArgument = uVar14;
    bVar1 = GetMatchedArguments(this,&matches,psVar11);
    if (!bVar1) {
      pIVar5 = this->Internals;
      if (pIVar5->UnknownArgumentCallback == (ErrorCallbackType)0x0) {
        if (this->StoreUnusedArgumentsFlag == true) {
          std::__cxx11::string::string(local_50,(string *)psVar11,0,0xffffffffffffffff);
          std::vector<cmsys::String,_std::allocator<cmsys::String>_>::emplace_back<cmsys::String>
                    (&(pIVar5->UnusedArguments).
                      super_vector<cmsys::String,_std::allocator<cmsys::String>_>,(String *)local_50
                    );
          std::__cxx11::string::~string(local_50);
          goto LAB_00118c16;
        }
        poVar6 = std::operator<<((ostream *)&std::cerr,"Got unknown argument: \"");
        poVar6 = std::operator<<(poVar6,(string *)psVar11);
        poVar6 = std::operator<<(poVar6,"\"");
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      else {
        iVar2 = (*pIVar5->UnknownArgumentCallback)((psVar11->_M_dataplus)._M_p,pIVar5->ClientData);
        iVar9 = 1;
        if (iVar2 != 0) goto LAB_00118c95;
      }
LAB_00118c8c:
      pIVar5 = this->Internals;
LAB_00118c8f:
      pIVar5->LastArgument = pIVar5->LastArgument - 1;
LAB_00118c93:
      iVar9 = 0;
      goto LAB_00118c95;
    }
    psVar7 = &(matches.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    lVar10 = 0;
    uVar3 = 0;
    for (lVar8 = 0;
        (long)matches.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)matches.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5 != lVar8; lVar8 = lVar8 + 1) {
      if (uVar3 < *psVar7) {
        uVar3 = *psVar7;
        lVar10 = lVar8;
      }
      psVar7 = psVar7 + 4;
    }
    pIVar5 = this->Internals;
    std::__cxx11::string::string
              (local_50,(string *)
                        (matches.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar10),0,0xffffffffffffffff);
    cs = std::
         map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
         ::operator[](&(pIVar5->Callbacks).
                       super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                      ,(key_type *)local_50);
    std::__cxx11::string::~string(local_50);
    __rhs = matches.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + lVar10;
    bVar1 = std::operator!=(cs->Argument,__rhs);
    if (bVar1) {
      abort();
    }
    switch(cs->ArgumentType) {
    case 0:
      bVar1 = PopulateVariable(this,cs,(char *)0x0);
      break;
    case 1:
      bVar1 = PopulateVariable(this,cs,(psVar11->_M_dataplus)._M_p + __rhs->_M_string_length);
      break;
    case 2:
      pIVar5 = this->Internals;
      lVar10 = (long)(pIVar5->Argv).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                     super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (uVar14 != ((long)(pIVar5->Argv).
                           super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                           super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl
                           .super__Vector_impl_data._M_finish - lVar10 >> 5) - 1U) {
        uVar14 = uVar14 + 1;
        bVar1 = PopulateVariable(this,cs,*(char **)(lVar10 + uVar14 * 0x20));
        break;
      }
      goto LAB_00118c8f;
    case 3:
      if ((psVar11->_M_string_length == __rhs->_M_string_length) ||
         (pcVar4 = (char *)std::__cxx11::string::at((ulong)psVar11), *pcVar4 != '='))
      goto LAB_00118c8c;
      bVar1 = PopulateVariable(this,cs,(psVar11->_M_dataplus)._M_p + __rhs->_M_string_length + 1);
      break;
    case 4:
      while( true ) {
        uVar12 = uVar14 + 1;
        lVar13 = lVar13 + 0x20;
        lVar10 = (long)(this->Internals->Argv).
                       super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                       super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                       super__Vector_impl_data._M_start;
        uVar3 = (long)(this->Internals->Argv).
                      super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                      super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                      super__Vector_impl_data._M_finish - lVar10 >> 5;
        if (uVar3 <= uVar12) break;
        psVar11 = (string *)(lVar10 + lVar13);
        bVar1 = GetMatchedArguments(this,&matches,psVar11);
        if (bVar1) {
          uVar3 = (long)(this->Internals->Argv).
                        super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                        super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->Internals->Argv).
                        super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                        super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                        super__Vector_impl_data._M_start >> 5;
          break;
        }
        bVar1 = PopulateVariable(this,cs,(psVar11->_M_dataplus)._M_p);
        uVar14 = uVar12;
        if (!bVar1) goto LAB_00118c93;
      }
      if (uVar3 == uVar12) {
        uVar14 = uVar12;
      }
      goto LAB_00118c16;
    default:
      poVar6 = std::operator<<((ostream *)&std::cerr,"Got unknown argument type: \"");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,cs->ArgumentType);
      poVar6 = std::operator<<(poVar6,"\"");
      std::endl<char,std::char_traits<char>>(poVar6);
      goto LAB_00118c8c;
    }
    if (bVar1 == false) goto LAB_00118c93;
LAB_00118c16:
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

int CommandLineArguments::Parse()
{
  std::vector<std::string>::size_type cc;
  std::vector<std::string> matches;
  if (this->StoreUnusedArgumentsFlag) {
    this->Internals->UnusedArguments.clear();
  }
  for (cc = 0; cc < this->Internals->Argv.size(); cc++) {
    const std::string& arg = this->Internals->Argv[cc];
    CommandLineArguments_DEBUG("Process argument: " << arg);
    this->Internals->LastArgument = cc;
    if (this->GetMatchedArguments(&matches, arg)) {
      // Ok, we found one or more arguments that match what user specified.
      // Let's find the longest one.
      CommandLineArguments::Internal::VectorOfStrings::size_type kk;
      CommandLineArguments::Internal::VectorOfStrings::size_type maxidx = 0;
      CommandLineArguments::Internal::String::size_type maxlen = 0;
      for (kk = 0; kk < matches.size(); kk++) {
        if (matches[kk].size() > maxlen) {
          maxlen = matches[kk].size();
          maxidx = kk;
        }
      }
      // So, the longest one is probably the right one. Now see if it has any
      // additional value
      CommandLineArgumentsCallbackStructure* cs =
        &this->Internals->Callbacks[matches[maxidx]];
      const std::string& sarg = matches[maxidx];
      if (cs->Argument != sarg) {
        abort();
      }
      switch (cs->ArgumentType) {
        case NO_ARGUMENT:
          // No value
          if (!this->PopulateVariable(cs, nullptr)) {
            return 0;
          }
          break;
        case SPACE_ARGUMENT:
          if (cc == this->Internals->Argv.size() - 1) {
            this->Internals->LastArgument--;
            return 0;
          }
          CommandLineArguments_DEBUG("This is a space argument: "
                                     << arg << " value: "
                                     << this->Internals->Argv[cc + 1]);
          // Value is the next argument
          if (!this->PopulateVariable(cs,
                                      this->Internals->Argv[cc + 1].c_str())) {
            return 0;
          }
          cc++;
          break;
        case EQUAL_ARGUMENT:
          if (arg.size() == sarg.size() || arg.at(sarg.size()) != '=') {
            this->Internals->LastArgument--;
            return 0;
          }
          // Value is everythng followed the '=' sign
          if (!this->PopulateVariable(cs, arg.c_str() + sarg.size() + 1)) {
            return 0;
          }
          break;
        case CONCAT_ARGUMENT:
          // Value is whatever follows the argument
          if (!this->PopulateVariable(cs, arg.c_str() + sarg.size())) {
            return 0;
          }
          break;
        case MULTI_ARGUMENT:
          // Suck in all the rest of the arguments
          CommandLineArguments_DEBUG("This is a multi argument: " << arg);
          for (cc++; cc < this->Internals->Argv.size(); ++cc) {
            const std::string& marg = this->Internals->Argv[cc];
            CommandLineArguments_DEBUG(
              " check multi argument value: " << marg);
            if (this->GetMatchedArguments(&matches, marg)) {
              CommandLineArguments_DEBUG("End of multi argument "
                                         << arg << " with value: " << marg);
              break;
            }
            CommandLineArguments_DEBUG(
              " populate multi argument value: " << marg);
            if (!this->PopulateVariable(cs, marg.c_str())) {
              return 0;
            }
          }
          if (cc != this->Internals->Argv.size()) {
            CommandLineArguments_DEBUG("Again End of multi argument " << arg);
            cc--;
            continue;
          }
          break;
        default:
          std::cerr << "Got unknown argument type: \"" << cs->ArgumentType
                    << "\"" << std::endl;
          this->Internals->LastArgument--;
          return 0;
      }
    } else {
      // Handle unknown arguments
      if (this->Internals->UnknownArgumentCallback) {
        if (!this->Internals->UnknownArgumentCallback(
              arg.c_str(), this->Internals->ClientData)) {
          this->Internals->LastArgument--;
          return 0;
        }
        return 1;
      } else if (this->StoreUnusedArgumentsFlag) {
        CommandLineArguments_DEBUG("Store unused argument " << arg);
        this->Internals->UnusedArguments.push_back(arg);
      } else {
        std::cerr << "Got unknown argument: \"" << arg << "\"" << std::endl;
        this->Internals->LastArgument--;
        return 0;
      }
    }
  }
  return 1;
}